

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.h
# Opt level: O3

void __thiscall
StackVector<std::pair<unsigned_long,_unsigned_long>_>::Push
          (StackVector<std::pair<unsigned_long,_unsigned_long>_> *this,
          pair<unsigned_long,_unsigned_long> In)

{
  pointer *pppVar1;
  iterator __position;
  long lVar2;
  pair<unsigned_long,_unsigned_long> local_18;
  
  local_18.second = In.second;
  local_18.first = In.first;
  lVar2 = (long)this->CurSize;
  if (lVar2 < 0x40) {
    this->CurSize = this->CurSize + 1;
    this->Stack[lVar2].first = local_18.first;
    this->Stack[lVar2].second = local_18.second;
  }
  else {
    __position._M_current =
         (this->Heap).
         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->Heap).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
      ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>const&>
                ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                  *)&this->Heap,__position,&local_18);
    }
    else {
      (__position._M_current)->first = local_18.first;
      (__position._M_current)->second = local_18.second;
      pppVar1 = &(this->Heap).
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
    this->CurSize = this->CurSize + 1;
  }
  return;
}

Assistant:

void Push(T In)
	{
		if (CurSize + 1 > STACKVECTOR_SIZE) {
			Heap.push_back(In);
			CurSize++;
		} else {
			Stack[CurSize++] = In;
		}
	}